

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-mltpctive-dynamical-system.cpp
# Opt level: O0

void __thiscall
stateObservation::IMUMltpctiveDynamicalSystem::stateSum
          (IMUMltpctiveDynamicalSystem *this,Vector *stateVector,Vector *tangentVector,Vector *sum)

{
  DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *other;
  Type local_618;
  Type local_5e8;
  Type local_5b8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>
  local_588;
  Type local_520;
  Type local_4f0;
  Type local_4c0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>
  local_490;
  Type local_428;
  Type local_3f8;
  Quaternion<double,0> local_3c8 [40];
  Type local_3a0;
  Vector3 local_370;
  Quaternion local_358;
  Quaternion<double,_0> local_338;
  Type local_310;
  Type local_2e0;
  Type local_2b0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>
  local_280;
  Type local_218;
  Type local_1e8;
  Type local_1b8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>
  local_188;
  Type local_120;
  Type local_f0;
  Type local_c0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>
  local_90;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_28;
  Vector *sum_local;
  Vector *tangentVector_local;
  Vector *stateVector_local;
  IMUMltpctiveDynamicalSystem *this_local;
  
  local_28 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)sum;
  sum_local = tangentVector;
  tangentVector_local = stateVector;
  stateVector_local = (Vector *)this;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&sum->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,0x13);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            (&local_c0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)tangentVector_local,0,3
            );
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            (&local_f0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)sum_local,0,3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>const,3,1,false>>::operator+
            (&local_90,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>> *)&local_c0
             ,(MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>
               *)&local_f0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>(&local_120,local_28,0,3);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false> *)&local_120,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>_>
              *)&local_90);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            (&local_1b8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)tangentVector_local,7,
             3);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            (&local_1e8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)sum_local,6,3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>const,3,1,false>>::operator+
            (&local_188,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>> *)
             &local_1b8,
             (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *
             )&local_1e8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>(&local_218,local_28,7,3);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false> *)&local_218,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>_>
              *)&local_188);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            (&local_2b0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)tangentVector_local,
             0xd,3);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            (&local_2e0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)sum_local,0xc,3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>const,3,1,false>>::operator+
            (&local_280,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>> *)
             &local_2b0,
             (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *
             )&local_2e0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>(&local_310,local_28,0xd,3);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false> *)&local_310,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>_>
              *)&local_280);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            (&local_3a0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)sum_local,3,3);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            ((Matrix<double,3,1,0,3,1> *)&local_370,
             (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
             &local_3a0);
  kine::rotationVectorToQuaternion(&local_358,&local_370);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<4>
            (&local_3f8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)tangentVector_local,3,
             4);
  Eigen::Quaternion<double,0>::
  Quaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,4,1,false>>
            (local_3c8,
             (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>_> *
             )&local_3f8);
  Eigen::QuaternionBase<Eigen::Quaternion<double,0>>::operator*
            (&local_338,(QuaternionBase<Eigen::Quaternion<double,0>> *)&local_358,
             (QuaternionBase<Eigen::Quaternion<double,_0>_> *)local_3c8);
  other = (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
          Eigen::Quaternion<double,_0>::coeffs(&local_338);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<4>(&local_428,local_28,3,4);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,4,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,4,1,false> *)&local_428,other);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            (&local_4c0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)tangentVector_local,10
             ,3);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            (&local_4f0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)sum_local,9,3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>const,3,1,false>>::operator+
            (&local_490,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>> *)
             &local_4c0,
             (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *
             )&local_4f0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>(&local_520,local_28,10,3);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false> *)&local_520,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>_>
              *)&local_490);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            (&local_5b8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)tangentVector_local,
             0x10,3);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            (&local_5e8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)sum_local,0xf,3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>const,3,1,false>>::operator+
            (&local_588,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>> *)
             &local_5b8,
             (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *
             )&local_5e8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>(&local_618,local_28,0x10,3);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false> *)&local_618,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>_>
              *)&local_588);
  return;
}

Assistant:

void IMUMltpctiveDynamicalSystem::stateSum(const Vector & stateVector, const Vector & tangentVector, Vector & sum)
{
  sum.resize(indexes::size);
  sum.segment<3>(indexes::pos) = stateVector.segment<3>(indexes::pos) + tangentVector.segment<3>(indexesTangent::pos);
  sum.segment<3>(indexes::linVel) =
      stateVector.segment<3>(indexes::linVel) + tangentVector.segment<3>(indexesTangent::linVel);
  sum.segment<3>(indexes::linAcc) =
      stateVector.segment<3>(indexes::linAcc) + tangentVector.segment<3>(indexesTangent::linAcc);

  sum.segment<4>(indexes::ori) = (kine::rotationVectorToQuaternion(tangentVector.segment<3>(indexesTangent::ori))
                                  * Quaternion(stateVector.segment<4>(indexes::ori)))
                                     .coeffs();
  sum.segment<3>(indexes::angVel) =
      stateVector.segment<3>(indexes::angVel) + tangentVector.segment<3>(indexesTangent::angVel);
  sum.segment<3>(indexes::angAcc) =
      stateVector.segment<3>(indexes::angAcc) + tangentVector.segment<3>(indexesTangent::angAcc);
}